

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

ostream * fasttext::operator<<(ostream *os,Vector *v)

{
  undefined8 in_RAX;
  ostream *poVar1;
  long lVar2;
  undefined8 uStack_28;
  
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 5;
  if (0 < (long)(v->data_).size_) {
    lVar2 = 0;
    uStack_28 = in_RAX;
    do {
      poVar1 = std::ostream::_M_insert<double>((double)(v->data_).mem_[lVar2]);
      uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (long)(v->data_).size_);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vector& v) {
  os << std::setprecision(5);
  for (int64_t j = 0; j < v.size(); j++) {
    os << v[j] << ' ';
  }
  return os;
}